

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<IfStatementAstNode>_> * __thiscall
Parser::parseIfStatement
          (optional<std::shared_ptr<IfStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool *pbVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  TokenType type;
  undefined1 local_d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [8];
  optional<std::shared_ptr<StatementAstNode>_> elseStatement;
  optional<std::shared_ptr<StatementAstNode>_> ifStatement;
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  allocator<char> local_2a;
  byte local_29;
  bool error;
  
  local_29 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected an if",
             (allocator<char> *)
             &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
  pbVar1 = &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged;
  type = (TokenType)this;
  expect((Parser *)local_d8,type,(bool *)0xd,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::__cxx11::string::~string((string *)pbVar1);
  skipWhiteSpace(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a left paren after if",
             (allocator<char> *)
             &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
  expect((Parser *)(local_d8 + 0x10),type,(bool *)0x5,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::__cxx11::string::~string((string *)pbVar1);
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)
                  &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged,this)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a right paren after expression of if",
             (allocator<char> *)
             &elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
  expect((Parser *)local_b8,type,(bool *)0x6,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  std::__cxx11::string::~string((string *)pbVar1);
  parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)
                 &elseStatement.
                  super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
                  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged,this);
  elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ = 0;
  TokenBuffer::currentToken((TokenBuffer *)pbVar1);
  iVar2 = *(int *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ + 0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  if (iVar2 == 0xe) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
               "Expected an else",&local_2a);
    pbVar1 = &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged;
    expect((Parser *)(local_b8 + 0x10),type,(bool *)0xe,(string *)&local_29);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    std::__cxx11::string::~string((string *)pbVar1);
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)pbVar1,this);
    std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_copy_assign
              ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)local_98,
               (_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)pbVar1);
    std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)pbVar1);
    if (((local_29 != 0) ||
        (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ !=
         '\x01')) ||
       ((ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ != '\x01'
        || (local_29 = elseStatement.
                       super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                       .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                       _8_1_ ^ 1,
           elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
           _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
           .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ ==
           '\0')))) {
LAB_0010b71d:
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<IfStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<IfStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<IfStatementAstNode>_>._M_engaged = false;
      goto LAB_0010b721;
    }
    std::
    make_shared<IfStatementAstNode,std::shared_ptr<ExpressionAstNode>&,std::shared_ptr<StatementAstNode>&,std::shared_ptr<StatementAstNode>&>
              ((shared_ptr<ExpressionAstNode> *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
               (shared_ptr<StatementAstNode> *)
               &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged,
               (shared_ptr<StatementAstNode> *)
               &elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
  }
  else {
    if (((local_29 != 0) ||
        (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ !=
         '\x01')) ||
       (local_29 = ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_
                   ^ 1,
       ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\0'))
    goto LAB_0010b71d;
    std::
    make_shared<IfStatementAstNode,std::shared_ptr<ExpressionAstNode>&,std::shared_ptr<StatementAstNode>&>
              ((shared_ptr<ExpressionAstNode> *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
               (shared_ptr<StatementAstNode> *)
               &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
  }
  _Var3._M_pi = local_48[0]._M_pi;
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<IfStatementAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<IfStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IfStatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<IfStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
  local_48[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<IfStatementAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<IfStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IfStatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<IfStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<IfStatementAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<IfStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IfStatementAstNode>_>._M_engaged = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
LAB_0010b721:
  std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)local_98);
  std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)
             &elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
  std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)
             &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<IfStatementAstNode>>
Parser::parseIfStatement() noexcept {
  bool error = false;

  this->expect(TokenType::If, error, "Expected an if");

  this->skipWhiteSpace();

  this->expect(TokenType::LeftParen, error, "Expected a left paren after if");

  auto expression = this->parseExpression();

  this->expect(TokenType::RightParen, error, "Expected a right paren after expression of if");

  auto ifStatement = this->parseStatement();

  bool foundElse = false;
  std::optional<std::shared_ptr<StatementAstNode>> elseStatement{std::nullopt};

  if (this->tokenBuffer->currentToken()->tokenType == TokenType::Else) {
    foundElse = true;
    this->expect(TokenType::Else, error, "Expected an else");

    elseStatement = this->parseStatement();
  }

  if (foundElse) {
    error = error || !expression || !ifStatement || !elseStatement;

    if (error) { return std::nullopt; }

    return std::make_shared<IfStatementAstNode>(
      expression.value(), ifStatement.value(), elseStatement.value());
  }

  // else, we did not find an else

  error = error || !expression || !ifStatement;

  if (error) { return std::nullopt; }

  return std::make_shared<IfStatementAstNode>(expression.value(), ifStatement.value());
}